

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  TestRunInfo *pTVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  IColourImpl *pIVar5;
  ostream *poVar6;
  Colour colour;
  Colour local_49;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  poVar6 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam00000000001644a0 = 0x7e7e7e7e7e7e7e;
    uRam00000000001644a7._0_1_ = '~';
    uRam00000000001644a7._1_1_ = '~';
    uRam00000000001644a7._2_1_ = '~';
    uRam00000000001644a7._3_1_ = '~';
    uRam00000000001644a7._4_1_ = '~';
    uRam00000000001644a7._5_1_ = '~';
    uRam00000000001644a7._6_1_ = '~';
    uRam00000000001644a7._7_1_ = '~';
    DAT_00164490 = '~';
    DAT_00164490_1._0_1_ = '~';
    DAT_00164490_1._1_1_ = '~';
    DAT_00164490_1._2_1_ = '~';
    DAT_00164490_1._3_1_ = '~';
    DAT_00164490_1._4_1_ = '~';
    DAT_00164490_1._5_1_ = '~';
    DAT_00164490_1._6_1_ = '~';
    uRam0000000000164498 = 0x7e7e7e7e7e7e7e;
    DAT_0016449f = 0x7e;
    DAT_00164480 = '~';
    DAT_00164480_1._0_1_ = '~';
    DAT_00164480_1._1_1_ = '~';
    DAT_00164480_1._2_1_ = '~';
    DAT_00164480_1._3_1_ = '~';
    DAT_00164480_1._4_1_ = '~';
    DAT_00164480_1._5_1_ = '~';
    DAT_00164480_1._6_1_ = '~';
    uRam0000000000164488._0_1_ = '~';
    uRam0000000000164488._1_1_ = '~';
    uRam0000000000164488._2_1_ = '~';
    uRam0000000000164488._3_1_ = '~';
    uRam0000000000164488._4_1_ = '~';
    uRam0000000000164488._5_1_ = '~';
    uRam0000000000164488._6_1_ = '~';
    uRam0000000000164488._7_1_ = '~';
    DAT_00164470 = '~';
    DAT_00164470_1._0_1_ = '~';
    DAT_00164470_1._1_1_ = '~';
    DAT_00164470_1._2_1_ = '~';
    DAT_00164470_1._3_1_ = '~';
    DAT_00164470_1._4_1_ = '~';
    DAT_00164470_1._5_1_ = '~';
    DAT_00164470_1._6_1_ = '~';
    uRam0000000000164478._0_1_ = '~';
    uRam0000000000164478._1_1_ = '~';
    uRam0000000000164478._2_1_ = '~';
    uRam0000000000164478._3_1_ = '~';
    uRam0000000000164478._4_1_ = '~';
    uRam0000000000164478._5_1_ = '~';
    uRam0000000000164478._6_1_ = '~';
    uRam0000000000164478._7_1_ = '~';
    getLineOfChars<(char)126>()::line = '~';
    getLineOfChars<(char)126>()::line_1._0_1_ = '~';
    getLineOfChars<(char)126>()::line_1._1_1_ = '~';
    getLineOfChars<(char)126>()::line_1._2_1_ = '~';
    getLineOfChars<(char)126>()::line_1._3_1_ = '~';
    getLineOfChars<(char)126>()::line_1._4_1_ = '~';
    getLineOfChars<(char)126>()::line_1._5_1_ = '~';
    getLineOfChars<(char)126>()::line_1._6_1_ = '~';
    uRam0000000000164468._0_1_ = '~';
    uRam0000000000164468._1_1_ = '~';
    uRam0000000000164468._2_1_ = '~';
    uRam0000000000164468._3_1_ = '~';
    uRam0000000000164468._4_1_ = '~';
    uRam0000000000164468._5_1_ = '~';
    uRam0000000000164468._6_1_ = '~';
    uRam0000000000164468._7_1_ = '~';
    DAT_001644af = 0;
  }
  sVar4 = strlen(&getLineOfChars<(char)126>()::line);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,&getLineOfChars<(char)126>()::line,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  local_49.m_moved = false;
  pIVar5 = Colour::impl();
  (**(code **)(*(long *)pIVar5 + 0x10))(pIVar5,0x17);
  pTVar1 = (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
           nullableValue;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).stream,(pTVar1->name)._M_dataplus._M_p,
                      (pTVar1->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," is a Catch v",0xd);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," b",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"master","");
  iVar3 = std::__cxx11::string::compare((char *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar3 != 0) {
    poVar6 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
    pcVar2 = DAT_001643f8;
    if (DAT_001643f8 == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar4 = strlen(DAT_001643f8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar2,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  }
  poVar6 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," host application.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Run with -? for options\n\n",0x19);
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::~Colour(&local_49);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion.majorVersion << "."
                    << libraryVersion.minorVersion << " b"
                    << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                stream << " (" << libraryVersion.branchName << ")";
            stream  << " host application.\n"
                    << "Run with -? for options\n\n";

            currentTestRunInfo.used = true;
        }